

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O3

vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *
jhu::thrax::minimalConsistentPairs
          (vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
           *__return_storage_ptr__,Alignment *a,int maxSize)

{
  ushort uVar1;
  pointer pPVar2;
  pointer pSVar3;
  SpanPair sp;
  bool bVar4;
  optional<jhu::thrax::Span> oVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  pointer pSVar9;
  pointer pSVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  Span src;
  SpanPair *pSVar14;
  SpanPair *pSVar15;
  SpanPair *pSVar16;
  pointer pPVar17;
  pointer local_58;
  SpanPair local_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::reserve
            (__return_storage_ptr__,
             ((long)(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * (long)maxSize);
  local_58 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_38 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_58 != local_38) {
    do {
      pPVar17 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (a->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar17 != pPVar2) {
        uVar1 = local_58->src;
        iVar11 = (uint)uVar1 * 0x10000;
        do {
          iVar7 = (ushort)pPVar17->src + 1;
          sVar6 = (short)iVar7;
          if ((short)uVar1 < sVar6) {
            pSVar10 = (__return_storage_ptr__->
                      super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar3 = (__return_storage_ptr__->
                     super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            src = (Span)(iVar7 * 0x10000 | (uint)uVar1);
            uVar13 = (long)pSVar3 - (long)pSVar10;
            iVar7 = (int)sVar6;
            if (0 < (long)uVar13 >> 5) {
              pSVar9 = (pointer)((long)&(pSVar10->src).start + (uVar13 & 0xffffffffffffffe0));
              lVar12 = ((long)uVar13 >> 5) + 1;
              pSVar10 = pSVar10 + 2;
              do {
                if (((int)pSVar10[-2].src << 0x10 == iVar11) &&
                   ((int)pSVar10[-2].src >> 0x10 == iVar7)) {
                  pSVar10 = pSVar10 + -2;
                  goto LAB_0010a083;
                }
                if (((int)pSVar10[-1].src << 0x10 == iVar11) &&
                   ((int)pSVar10[-1].src >> 0x10 == iVar7)) {
                  pSVar10 = pSVar10 + -1;
                  goto LAB_0010a083;
                }
                if (((int)pSVar10->src << 0x10 == iVar11) && ((int)pSVar10->src >> 0x10 == iVar7))
                goto LAB_0010a083;
                if (((int)pSVar10[1].src << 0x10 == iVar11) &&
                   ((int)pSVar10[1].src >> 0x10 == iVar7)) {
                  pSVar10 = pSVar10 + 1;
                  goto LAB_0010a083;
                }
                lVar12 = lVar12 + -1;
                pSVar10 = pSVar10 + 4;
              } while (1 < lVar12);
              uVar13 = (long)pSVar3 - (long)pSVar9;
              pSVar10 = pSVar9;
            }
            lVar12 = (long)uVar13 >> 3;
            if (lVar12 == 1) {
LAB_0010a067:
              if (src != pSVar10->src) {
                pSVar10 = pSVar3;
              }
LAB_0010a083:
              if (pSVar10 != pSVar3) goto LAB_0010a0ed;
            }
            else {
              if (lVar12 == 2) {
LAB_0010a05e:
                if (src != pSVar10->src) {
                  pSVar10 = pSVar10 + 1;
                  goto LAB_0010a067;
                }
                goto LAB_0010a083;
              }
              if (lVar12 == 3) {
                if (src != pSVar10->src) {
                  pSVar10 = pSVar10 + 1;
                  goto LAB_0010a05e;
                }
                goto LAB_0010a083;
              }
            }
            iVar7 = iVar7 - (short)uVar1;
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            if (maxSize < iVar7) break;
            oVar5 = minimalTargetSpan(a,src);
            if (((uint6)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                        super__Optional_payload_base<jhu::thrax::Span> & 0x100000000) != 0) {
              uVar8 = ((int)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                            super__Optional_payload_base<jhu::thrax::Span>._M_payload >> 0x10) -
                      (int)(short)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>.
                                  _M_payload.super__Optional_payload_base<jhu::thrax::Span>.
                                  _M_payload._0_2_;
              if ((int)uVar8 < 1) {
                uVar8 = 0;
              }
              if (uVar8 <= (uint)maxSize) {
                local_40.tgt = (Span)((uint)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>
                                            ._M_payload.
                                            super__Optional_payload_base<jhu::thrax::Span>.
                                            _M_payload._0_2_ |
                                     (uint)oVar5.super__Optional_base<jhu::thrax::Span,_true,_true>.
                                           _M_payload.super__Optional_payload_base<jhu::thrax::Span>
                                           ._M_payload & 0xffff0000);
                local_40.src = src;
                std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::
                emplace_back<jhu::thrax::SpanPair>(__return_storage_ptr__,&local_40);
              }
            }
          }
LAB_0010a0ed:
          pPVar17 = pPVar17 + 1;
        } while (pPVar17 != pPVar2);
      }
      local_58 = local_58 + 1;
    } while (local_58 != local_38);
  }
  pSVar14 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar16 = (__return_storage_ptr__->
            super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  uVar13 = (long)pSVar16 - (long)pSVar14;
  if (0 < (long)uVar13 >> 5) {
    pSVar15 = (SpanPair *)((long)&(pSVar14->src).start + (uVar13 & 0xffffffffffffffe0));
    lVar12 = ((long)uVar13 >> 5) + 1;
    pSVar14 = pSVar14 + 2;
    do {
      bVar4 = isConsistent(a,pSVar14[-2]);
      if (!bVar4) {
        pSVar14 = pSVar14 + -2;
        goto LAB_0010a20f;
      }
      bVar4 = isConsistent(a,pSVar14[-1]);
      if (!bVar4) {
        pSVar14 = pSVar14 + -1;
        goto LAB_0010a20f;
      }
      bVar4 = isConsistent(a,*pSVar14);
      if (!bVar4) goto LAB_0010a20f;
      bVar4 = isConsistent(a,pSVar14[1]);
      if (!bVar4) {
        pSVar14 = pSVar14 + 1;
        goto LAB_0010a20f;
      }
      lVar12 = lVar12 + -1;
      pSVar14 = pSVar14 + 4;
    } while (1 < lVar12);
    uVar13 = (long)pSVar16 - (long)pSVar15;
    pSVar14 = pSVar15;
  }
  lVar12 = (long)uVar13 >> 3;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      if (lVar12 != 3) {
        return __return_storage_ptr__;
      }
      bVar4 = isConsistent(a,*pSVar14);
      if (!bVar4) goto LAB_0010a20f;
      pSVar14 = pSVar14 + 1;
    }
    bVar4 = isConsistent(a,*pSVar14);
    if (!bVar4) goto LAB_0010a20f;
    pSVar14 = pSVar14 + 1;
  }
  bVar4 = isConsistent(a,*pSVar14);
  if (bVar4) {
    pSVar14 = pSVar16;
  }
LAB_0010a20f:
  pSVar15 = pSVar14 + 1;
  if (pSVar15 != pSVar16 && pSVar14 != pSVar16) {
    do {
      sp = *pSVar15;
      bVar4 = isConsistent(a,sp);
      if (bVar4) {
        *pSVar14 = sp;
        pSVar14 = pSVar14 + 1;
      }
      pSVar15 = pSVar15 + 1;
    } while (pSVar15 != pSVar16);
    pSVar16 = (__return_storage_ptr__->
              super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar14 != pSVar16) {
    (__return_storage_ptr__->
    super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar14;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SpanPair> minimalConsistentPairs(const Alignment& a, int maxSize) {
  std::vector<SpanPair> result;
  result.reserve(maxSize * a.size());  // over-estimate
  for (auto startPoint : a) {
    for (auto endPoint : a) {
      Span src{ startPoint.src, static_cast<IndexType>(endPoint.src + 1) };
      if (src.empty()) {
        continue;
      } else if (auto it = std::find_if(
          result.begin(), result.end(), [src](auto p) { return src == p.src; });
          it != result.end()) {
        continue;
      } else if (src.size() > maxSize) {
        break;
      }
      if (auto tgt = minimalTargetSpan(a, src);
          tgt.has_value() && tgt->size() <= maxSize) {
        result.push_back(SpanPair{ src, *tgt });
      }
    }
  }
  auto it = std::remove_if(
      result.begin(),
      result.end(),
      [&a](auto sp) { return !isConsistent(a, sp); });
  result.erase(it, result.end());
  return result;
}